

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

void __thiscall TRM::Vertex::insert_above(Vertex *this,Edge *e)

{
  Vertex *pVVar1;
  Edge *this_00;
  bool bVar2;
  Vertex *pVVar3;
  Edge *pEVar4;
  
  pVVar3 = e->top;
  pVVar1 = e->bottom;
  if ((*(float *)(pVVar3 + 0x48) == *(float *)(pVVar1 + 0x48)) &&
     (!NAN(*(float *)(pVVar3 + 0x48)) && !NAN(*(float *)(pVVar1 + 0x48)))) {
    if ((*(float *)(pVVar3 + 0x4c) == *(float *)(pVVar1 + 0x4c)) &&
       (!NAN(*(float *)(pVVar3 + 0x4c)) && !NAN(*(float *)(pVVar1 + 0x4c)))) {
      return;
    }
  }
  bVar2 = VertexCompare::Compare((vec2 *)(pVVar1 + 0x48),(vec2 *)(pVVar3 + 0x48));
  if (!bVar2) {
    pVVar3 = this + 0x18;
    pEVar4 = (Edge *)0x0;
    while ((this_00 = *(Edge **)pVVar3, this_00 != (Edge *)0x0 &&
           (bVar2 = Edge::is_right_of(this_00,(vec2 *)(e->top + 0x48)), !bVar2))) {
      pVVar3 = (Vertex *)&this_00->above_next;
      pEVar4 = this_00;
    }
    pVVar3 = (Vertex *)&pEVar4->above_next;
    if (pEVar4 == (Edge *)0x0) {
      pVVar3 = this + 0x18;
    }
    e->above_prev = pEVar4;
    e->above_next = this_00;
    *(Edge **)pVVar3 = e;
    pVVar3 = (Vertex *)&this_00->above_prev;
    if (this_00 == (Edge *)0x0) {
      pVVar3 = this + 0x20;
    }
    *(Edge **)pVVar3 = e;
  }
  return;
}

Assistant:

void Vertex::insert_above(Edge* e) {
  if (e->top->point == e->bottom->point ||                     // no edge
      VertexCompare::Compare(e->bottom->point, e->top->point)  // not above
  ) {
    return;
  }

  Edge* above_prev = nullptr;
  Edge* above_next = nullptr;

  for (above_next = edge_above.head; above_next != nullptr;
       above_next = above_next->above_next) {
    if (above_next->is_right_of(e->top->point)) {
      break;
    }

    above_prev = above_next;
  }

  LinkedList<Edge>::Insert<&Edge::above_prev, &Edge::above_next>(
      e, above_prev, above_next, &edge_above.head, &edge_above.tail);
}